

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O3

void __thiscall
hypermind::CompileUnit::EmitBindMethod(CompileUnit *this,Signature signature,HMBool isStatic)

{
  uint uVar1;
  HMInteger operand;
  
  uVar1 = this->mStackSlotNum - 1;
  this->mStackSlotNum = uVar1;
  if (this->mFn->maxStackSlotNum < uVar1) {
    this->mFn->maxStackSlotNum = uVar1;
  }
  WriteOpcode(this,isStatic | BindInstanceMethod);
  operand = SymbolTable::EnsureFind(&this->mVM->mAllMethods,&this->mVM->mGCHeap,signature);
  WriteShortOperand(this,operand);
  return;
}

Assistant:

void EmitBindMethod(Signature signature, HMBool isStatic) {
            STACK_CHANGE(-1);
            WriteOpcode(isStatic ? Opcode::BindStaticMethod : Opcode::BindInstanceMethod);
            HMInteger index = mVM->mAllMethods.EnsureFind(&mVM->mGCHeap, signature);
            WriteShortOperand(index);
        }